

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void geopolyBBoxFinal(sqlite3_context *context)

{
  char *pcVar1;
  GeoPoly *p;
  
  if ((short)context->pMem->flags < 0) {
    pcVar1 = context->pMem->z;
  }
  else {
    pcVar1 = (char *)createAggContext(context,0);
  }
  if (pcVar1 != (char *)0x0) {
    p = geopolyBBox(context,(sqlite3_value *)0x0,(RtreeCoord *)(pcVar1 + 4),(int *)0x0);
    if (p != (GeoPoly *)0x0) {
      setResultStrOrError(context,(char *)p->hdr,p->nVertex * 8 + 4,'\0',
                          (_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(p);
      return;
    }
  }
  return;
}

Assistant:

static void geopolyBBoxFinal(
  sqlite3_context *context
){
  GeoPoly *p;
  GeoBBox *pBBox;
  pBBox = (GeoBBox*)sqlite3_aggregate_context(context, 0);
  if( pBBox==0 ) return;
  p = geopolyBBox(context, 0, pBBox->a, 0);
  if( p ){
    sqlite3_result_blob(context, p->hdr,
       4+8*p->nVertex, SQLITE_TRANSIENT);
    sqlite3_free(p);
  }
}